

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

void __thiscall Vector<long_double>::Vector(Vector<long_double> *this,int csize,longdouble *val)

{
  longdouble *plVar1;
  ulong uVar2;
  longdouble *plVar3;
  
  this->num_elts = 0;
  this->ptr_to_data = (longdouble *)0x0;
  if (csize < 1) {
    uVar2 = 0;
    plVar1 = (longdouble *)0x0;
  }
  else {
    this->num_elts = csize;
    uVar2 = (ulong)(uint)csize;
    plVar1 = (longdouble *)operator_new__(uVar2 << 4);
    this->ptr_to_data = plVar1;
  }
  for (plVar3 = plVar1 + uVar2; plVar1 < plVar3; plVar3 = plVar3 + -1) {
    plVar3[-1] = *val;
  }
  return;
}

Assistant:

Vector< T >::Vector(int csize, const T& val) : num_elts(0), ptr_to_data((T*)0)
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector(int, const T& )|size constructor   |";
#endif

    if (csize > 0 ){
	num_elts = csize;
	ptr_to_data = new T[num_elts];

	if ( ptr_to_data == 0 ) error("Vector<>::Vector(), Memoire insuffisante");
    } 

  T* p = ptr_to_data + num_elts;
  while ( p > ptr_to_data ) 
    *--p = val;//pb si = n'est pas surcharge pour le type T

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}